

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# webpmux.c
# Opt level: O0

int GetFrame(WebPMux *mux,Config *config)

{
  uint uVar1;
  WebPMuxError err_00;
  char *pcVar2;
  WebPMux *pWVar3;
  WebPMuxFrameInfo info;
  WebPChunkId id;
  int parse_error;
  int ok;
  int num;
  WebPMux *mux_single;
  WebPMuxError err;
  int in_stack_ffffffffffffff7c;
  undefined7 in_stack_ffffffffffffff80;
  undefined1 in_stack_ffffffffffffff87;
  byte bVar4;
  WebPMuxFrameInfo *in_stack_ffffffffffffff88;
  FILE *pFVar5;
  undefined8 in_stack_ffffffffffffff90;
  uint32_t nth;
  WebPMux *in_stack_ffffffffffffff98;
  char *in_stack_ffffffffffffffa0;
  WebPMux *in_stack_ffffffffffffffa8;
  int in_stack_ffffffffffffffbc;
  WebPData *in_stack_ffffffffffffffc0;
  WebPMux *in_stack_ffffffffffffffc8;
  int local_28;
  WebPMuxError local_14;
  
  nth = (uint32_t)((ulong)in_stack_ffffffffffffff90 >> 0x20);
  WebPDataInit((WebPData *)0x104daf);
  uVar1 = ExUtilGetInt((char *)CONCAT17(in_stack_ffffffffffffff87,in_stack_ffffffffffffff80),
                       in_stack_ffffffffffffff7c,(int *)0x104dcb);
  if ((int)uVar1 < 0) {
    fprintf(_stderr,"ERROR: Frame/Fragment index must be non-negative.\n");
    local_28 = 0;
  }
  else {
    local_14 = WebPMuxGetFrame(in_stack_ffffffffffffff98,nth,in_stack_ffffffffffffff88);
    if ((local_14 == WEBP_MUX_OK) && (in_stack_ffffffffffffffbc != 3)) {
      local_14 = WEBP_MUX_NOT_FOUND;
    }
    if (local_14 == WEBP_MUX_OK) {
      pWVar3 = WebPMuxNew();
      if (pWVar3 == (WebPMux *)0x0) {
        pFVar5 = _stderr;
        pcVar2 = ErrorString(WEBP_MUX_MEMORY_ERROR);
        fprintf(pFVar5,"ERROR (%s): Could not allocate a mux object.\n",pcVar2);
        local_28 = 0;
      }
      else {
        err_00 = WebPMuxSetImage(in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0,
                                 in_stack_ffffffffffffffbc);
        if (err_00 == WEBP_MUX_OK) {
          local_28 = WriteWebP(in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0);
        }
        else {
          pFVar5 = _stderr;
          pcVar2 = ErrorString(err_00);
          fprintf(pFVar5,"ERROR (%s): Could not create single image mux object.\n",pcVar2);
          local_28 = 0;
        }
      }
    }
    else {
      pFVar5 = _stderr;
      pcVar2 = ErrorString(local_14);
      fprintf(pFVar5,"ERROR (%s): Could not get frame %d.\n",pcVar2,(ulong)uVar1);
      local_28 = 0;
    }
  }
  WebPDataClear((WebPData *)0x104f4d);
  WebPMuxDelete((WebPMux *)0x104f57);
  bVar4 = 0;
  if (local_28 != 0) {
    bVar4 = 0xff;
  }
  return (int)(bVar4 & 1);
}

Assistant:

static int GetFrame(const WebPMux* mux, const Config* config) {
  WebPMuxError err = WEBP_MUX_OK;
  WebPMux* mux_single = NULL;
  int num = 0;
  int ok = 1;
  int parse_error = 0;
  const WebPChunkId id = WEBP_CHUNK_ANMF;
  WebPMuxFrameInfo info;
  WebPDataInit(&info.bitstream);

  num = ExUtilGetInt(config->args_[0].params_, 10, &parse_error);
  if (num < 0) {
    ERROR_GOTO1("ERROR: Frame/Fragment index must be non-negative.\n", ErrGet);
  }
  if (parse_error) goto ErrGet;

  err = WebPMuxGetFrame(mux, num, &info);
  if (err == WEBP_MUX_OK && info.id != id) err = WEBP_MUX_NOT_FOUND;
  if (err != WEBP_MUX_OK) {
    ERROR_GOTO3("ERROR (%s): Could not get frame %d.\n",
                ErrorString(err), num, ErrGet);
  }

  mux_single = WebPMuxNew();
  if (mux_single == NULL) {
    err = WEBP_MUX_MEMORY_ERROR;
    ERROR_GOTO2("ERROR (%s): Could not allocate a mux object.\n",
                ErrorString(err), ErrGet);
  }
  err = WebPMuxSetImage(mux_single, &info.bitstream, 1);
  if (err != WEBP_MUX_OK) {
    ERROR_GOTO2("ERROR (%s): Could not create single image mux object.\n",
                ErrorString(err), ErrGet);
  }

  ok = WriteWebP(mux_single, config->output_);

 ErrGet:
  WebPDataClear(&info.bitstream);
  WebPMuxDelete(mux_single);
  return ok && !parse_error;
}